

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3HashInsert(Hash *pH,char *pKey,void *data)

{
  uint *puVar1;
  _ht *p_Var2;
  HashElem *pHVar3;
  HashElem *pHVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  HashElem *pHVar8;
  _ht *p_Var9;
  byte *pbVar10;
  byte bVar11;
  HashElem *pHVar12;
  void *pvVar13;
  uint h;
  uint local_44;
  ulong local_40;
  _ht *local_38;
  
  pHVar8 = findElementWithHash(pH,pKey,&local_44);
  pvVar13 = pHVar8->data;
  if (pvVar13 == (void *)0x0) {
    if (data != (void *)0x0) {
      pHVar8 = (HashElem *)sqlite3Malloc(0x20);
      if (pHVar8 == (HashElem *)0x0) {
        return data;
      }
      pHVar8->pKey = pKey;
      pHVar8->data = data;
      uVar5 = pH->count + 1;
      pH->count = uVar5;
      if ((9 < uVar5) && (pH->htsize * 2 < uVar5)) {
        uVar7 = 0x40;
        if (uVar5 * 2 < 0x40) {
          uVar7 = uVar5 * 2;
        }
        if (uVar7 != pH->htsize) {
          if (sqlite3Hooks_0 != (code *)0x0) {
            (*sqlite3Hooks_0)();
          }
          p_Var9 = (_ht *)sqlite3Malloc((ulong)(uVar7 << 4));
          if (sqlite3Hooks_1 != (code *)0x0) {
            (*sqlite3Hooks_1)();
          }
          if (p_Var9 != (_ht *)0x0) {
            sqlite3_free(pH->ht);
            pH->ht = p_Var9;
            iVar6 = (*sqlite3Config.m.xSize)(p_Var9);
            local_40 = (ulong)(uint)(iVar6 >> 4);
            pH->htsize = iVar6 >> 4;
            uVar5 = 0;
            local_38 = p_Var9;
            memset(p_Var9,0,local_40 << 4);
            pHVar3 = pH->first;
            pH->first = (HashElem *)0x0;
            while (pHVar3 != (HashElem *)0x0) {
              pbVar10 = (byte *)pHVar3->pKey;
              bVar11 = *pbVar10;
              uVar7 = 0;
              if (bVar11 != 0) {
                uVar7 = 0;
                do {
                  pbVar10 = pbVar10 + 1;
                  uVar7 = (""[bVar11] + uVar7) * -0x61c8864f;
                  bVar11 = *pbVar10;
                } while (bVar11 != 0);
              }
              pHVar4 = pHVar3->next;
              insertElement(pH,local_38 + (ulong)uVar7 % (local_40 & 0xffffffff),pHVar3);
              pHVar3 = pHVar4;
            }
            bVar11 = *pKey;
            if (bVar11 != 0) {
              pbVar10 = (byte *)(pKey + 1);
              uVar5 = 0;
              do {
                uVar5 = (""[bVar11] + uVar5) * -0x61c8864f;
                bVar11 = *pbVar10;
                pbVar10 = pbVar10 + 1;
              } while (bVar11 != 0);
            }
            local_44 = uVar5 % pH->htsize;
          }
        }
      }
      p_Var9 = pH->ht + local_44;
      if (pH->ht == (_ht *)0x0) {
        p_Var9 = (_ht *)0x0;
      }
      insertElement(pH,p_Var9,pHVar8);
    }
    pvVar13 = (void *)0x0;
  }
  else if (data == (void *)0x0) {
    pHVar3 = pHVar8->next;
    pHVar4 = pHVar8->prev;
    pHVar12 = (HashElem *)&pH->first;
    if (pHVar4 != (HashElem *)0x0) {
      pHVar12 = pHVar4;
    }
    pHVar12->next = pHVar3;
    if (pHVar3 != (HashElem *)0x0) {
      pHVar3->prev = pHVar4;
    }
    p_Var9 = pH->ht;
    if (p_Var9 != (_ht *)0x0) {
      p_Var2 = p_Var9 + local_44;
      if (p_Var9[local_44].chain == pHVar8) {
        p_Var2->chain = pHVar3;
      }
      p_Var2->count = p_Var2->count - 1;
    }
    sqlite3_free(pHVar8);
    puVar1 = &pH->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      sqlite3HashClear(pH);
    }
  }
  else {
    pHVar8->data = data;
    pHVar8->pKey = pKey;
  }
  return pvVar13;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HashInsert(Hash *pH, const char *pKey, void *data){
  unsigned int h;       /* the hash of the key modulo hash table size */
  HashElem *elem;       /* Used to loop thru the element list */
  HashElem *new_elem;   /* New element added to the pH */

  assert( pH!=0 );
  assert( pKey!=0 );
  elem = findElementWithHash(pH,pKey,&h);
  if( elem->data ){
    void *old_data = elem->data;
    if( data==0 ){
      removeElementGivenHash(pH,elem,h);
    }else{
      elem->data = data;
      elem->pKey = pKey;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  new_elem = (HashElem*)sqlite3Malloc( sizeof(HashElem) );
  if( new_elem==0 ) return data;
  new_elem->pKey = pKey;
  new_elem->data = data;
  pH->count++;
  if( pH->count>=10 && pH->count > 2*pH->htsize ){
    if( rehash(pH, pH->count*2) ){
      assert( pH->htsize>0 );
      h = strHash(pKey) % pH->htsize;
    }
  }
  insertElement(pH, pH->ht ? &pH->ht[h] : 0, new_elem);
  return 0;
}